

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void http_handle_dir(nng_http *conn,void *arg,nng_aio *aio)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  nng_err nVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  nng_http_status status;
  nni_aio *aio_00;
  char *pcVar10;
  size_t sz;
  void *local_48;
  void *data;
  size_t size;
  
  pcVar9 = *arg;
  pcVar10 = *(char **)((long)arg + 8);
  pcVar5 = nni_http_get_uri(conn);
  sVar6 = strlen(pcVar9);
  if ((pcVar9[1] == '\0') ||
     ((iVar3 = strncmp(pcVar5,pcVar9,sVar6), iVar3 == 0 &&
      ((pcVar5[sVar6] == '\0' || (pcVar5[sVar6] == '/')))))) {
    size = (size_t)aio;
    sVar7 = strlen(pcVar10);
    sVar8 = strlen(pcVar5);
    sz = sVar7 + sVar8 + 0xd;
    pcVar9 = (char *)nni_alloc(sz);
    if (pcVar9 != (char *)0x0) {
      strcpy(pcVar9,pcVar10);
      sVar7 = strlen(pcVar9);
      pcVar10 = pcVar9 + sVar7;
      if ((sVar7 == 0) || (pcVar10[-1] != '/')) {
        *pcVar10 = '/';
        pcVar10 = pcVar10 + 1;
      }
      pcVar5 = pcVar5 + sVar6;
      do {
        cVar1 = *pcVar5;
        if (cVar1 == '/') {
          pcVar10[0] = '/';
          pcVar10[1] = '\0';
        }
        else {
          if ((cVar1 == '\0') || (cVar1 == '?')) goto LAB_00134e15;
          *pcVar10 = cVar1;
        }
        pcVar10 = pcVar10 + 1;
        pcVar5 = pcVar5 + 1;
      } while( true );
    }
    nVar4 = NNG_ENOMEM;
    aio = (nng_aio *)size;
  }
  else {
    nVar4 = NNG_EINVAL;
  }
  nni_aio_finish_error(aio,nVar4);
  return;
LAB_00134e15:
  *pcVar10 = '\0';
  _Var2 = nni_file_is_dir(pcVar9);
  if (_Var2) {
    sVar6 = strlen(pcVar9);
    snprintf(pcVar10,sz - sVar6,"%s%s","/","index.html");
    _Var2 = nni_file_is_file(pcVar9);
    if (_Var2) goto LAB_00134e7d;
    sVar6 = strlen(pcVar9);
    pcVar9[sVar6 - 1] = '\0';
    _Var2 = nni_file_is_file(pcVar9);
    if (_Var2) goto LAB_00134e7d;
    local_48 = (void *)0x0;
    data = (void *)0x0;
    http_lookup_type(pcVar9);
    nni_free(pcVar9,sz);
LAB_00134f64:
    status = NNG_HTTP_STATUS_NOT_FOUND;
  }
  else {
LAB_00134e7d:
    iVar3 = nni_file_get(pcVar9,&local_48,(size_t *)&data);
    pcVar10 = http_lookup_type(pcVar9);
    nni_free(pcVar9,sz);
    if (iVar3 == 0) {
      pcVar9 = "application/octet-stream";
      if (pcVar10 != (char *)0x0) {
        pcVar9 = pcVar10;
      }
      nVar4 = nng_http_set_header(conn,"Content-Type",pcVar9);
      aio_00 = (nni_aio *)size;
      if ((nVar4 == NNG_OK) &&
         (nVar4 = nng_http_copy_body(conn,local_48,(size_t)data), nVar4 == NNG_OK)) {
        nng_http_set_status(conn,NNG_HTTP_STATUS_OK,(char *)0x0);
        nni_free(local_48,(size_t)data);
        goto LAB_00134f9e;
      }
      nni_free(local_48,(size_t)data);
      goto LAB_00134f7b;
    }
    if (iVar3 == 0x10) {
      status = NNG_HTTP_STATUS_FORBIDDEN;
    }
    else {
      status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
      if (iVar3 == 0xc) goto LAB_00134f64;
    }
  }
  aio_00 = (nni_aio *)size;
  nVar4 = nni_http_set_error(conn,status,(char *)0x0,(char *)0x0);
  if (nVar4 == NNG_OK) {
LAB_00134f9e:
    nni_aio_finish(aio_00,NNG_OK,0);
    return;
  }
LAB_00134f7b:
  nni_aio_finish_error(aio_00,nVar4);
  return;
}

Assistant:

static void
http_handle_dir(nng_http *conn, void *arg, nng_aio *aio)
{
	void       *data;
	size_t      size;
	nng_err     rv;
	http_file  *hf   = arg;
	const char *path = hf->path;
	const char *base = hf->base;
	const char *uri  = nni_http_get_uri(conn);
	const char *ctype;
	char       *dst;
	size_t      len;
	size_t      pnsz;
	char       *pn;

	len = strlen(base);
	if (base[1] != '\0' && // Allows "/" as base
	    ((strncmp(uri, base, len) != 0) ||
	        ((uri[len] != 0) && (uri[len] != '/')))) {
		// This should never happen!
		nni_aio_finish_error(aio, NNG_EINVAL);
		return;
	}

	// simple worst case is every character in path is a separator
	// It's never actually that bad, because we we have /<something>/.
	pnsz = (strlen(path) + strlen(uri) + 2) * strlen(NNG_PLATFORM_DIR_SEP);
	pnsz += strlen("index.html") + 1; // +1 for term nul

	if ((pn = nni_alloc(pnsz)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}

	// make sure we have a "/" present.
	strcpy(pn, path);
	dst = pn + strlen(pn);

	if ((dst == pn) || (dst[-1] != '/')) {
		*dst++ = '/';
	}

	for (uri = uri + len; *uri != '\0'; uri++) {
		if (*uri == '?') {
			// Skip URI parameters
			break;
		} else if (*uri == '/') {
			strcpy(dst, NNG_PLATFORM_DIR_SEP);
			dst += sizeof(NNG_PLATFORM_DIR_SEP) - 1;
		} else {
			*dst++ = *uri;
		}
	}

	*dst = '\0';

	// This is a very simplistic file server, suitable only for small
	// files.  In the future we can use an AIO based file read, where
	// we read files a bit at a time, or even mmap them, and serve
	// them up chunkwise.  Applications could even come up with their
	// own caching version of the http handler.

	rv = 0;
	if (nni_file_is_dir(pn)) {
		snprintf(dst, pnsz - strlen(pn), "%s%s", NNG_PLATFORM_DIR_SEP,
		    "index.html");
		if (!nni_file_is_file(pn)) {
			pn[strlen(pn) - 1] = '\0'; // index.html -> index.htm
			if (!nni_file_is_file(pn)) {
				rv = NNG_ENOENT;
			}
		}
	}

	if (rv == NNG_OK) {
		rv = nni_file_get(pn, &data, &size);
	} else {
		data = NULL;
		size = 0;
	}
	ctype = http_lookup_type(pn);
	if (ctype == NULL) {
		ctype = "application/octet-stream";
	}

	nni_free(pn, pnsz);
	if (rv != NNG_OK) {
		nng_http_status status;

		switch (rv) {
		case NNG_ENOMEM:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		case NNG_ENOENT:
			status = NNG_HTTP_STATUS_NOT_FOUND;
			break;
		case NNG_EPERM:
			status = NNG_HTTP_STATUS_FORBIDDEN;
			break;
		default:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		}
		if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
		nni_aio_finish(aio, 0, 0);
		return;
	}

	if (((rv = nng_http_set_header(conn, "Content-Type", ctype)) != 0) ||
	    ((rv = nng_http_copy_body(conn, data, size)) != 0)) {
		nni_free(data, size);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_OK, NULL);

	nni_free(data, size);
	nni_aio_finish(aio, NNG_OK, 0);
}